

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

int vm_add_num(VM *vm,double num)

{
  int iVar1;
  Value VVar2;
  Value *pVVar3;
  int local_2c;
  int i;
  uint64_t converted;
  double num_local;
  VM *vm_local;
  
  VVar2 = n2v(num);
  local_2c = 0;
  while( true ) {
    if (vm->consts_count <= local_2c) {
      if (vm->consts_capacity <= vm->consts_count) {
        vm->consts_capacity = vm->consts_capacity << 1;
        pVVar3 = (Value *)realloc(vm->consts,(long)vm->consts_capacity << 3);
        vm->consts = pVVar3;
      }
      iVar1 = vm->consts_count;
      vm->consts_count = iVar1 + 1;
      vm->consts[iVar1] = VVar2;
      return vm->consts_count + -1;
    }
    if (vm->consts[local_2c] == VVar2) break;
    local_2c = local_2c + 1;
  }
  return local_2c;
}

Assistant:

int vm_add_num(VM *vm, double num) {
	uint64_t converted = n2v(num);

	// Check if the constant already exists
	for (int i = 0; i < vm->consts_count; i++) {
		if (vm->consts[i] == converted) {
			return i;
		}
	}

	// Resize the constants array if necessary
	if (vm->consts_count >= vm->consts_capacity) {
		vm->consts_capacity *= 2;
		vm->consts = realloc(vm->consts, sizeof(Value) * vm->consts_capacity);
	}

	// Add the converted number to the constants list if it doesn't already
	// exist
	vm->consts[vm->consts_count++] = converted;
	return vm->consts_count - 1;
}